

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslkey_p.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,QSslKey *key)

{
  KeyAlgorithm KVar1;
  QDebug *this;
  QSslKey *this_00;
  char *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  QSslKey *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  QDebug *local_68;
  char *local_60;
  QDebug *in_stack_ffffffffffffffa8;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,in_RSI);
  this = (QDebug *)QDebug::resetFormat();
  QDebug::nospace(this);
  QDebug::operator<<(in_stack_ffffffffffffffa8,in_RDX);
  QSslKey::type(in_stack_ffffffffffffff88);
  QDebug::operator<<(in_stack_ffffffffffffffa8,in_RDX);
  QDebug::operator<<(in_stack_ffffffffffffffa8,in_RDX);
  KVar1 = QSslKey::algorithm(in_stack_ffffffffffffff88);
  if (KVar1 == Opaque) {
    local_60 = "OPAQUE";
  }
  else {
    KVar1 = QSslKey::algorithm(in_stack_ffffffffffffff88);
    if (KVar1 == Rsa) {
      local_60 = "RSA";
    }
    else {
      KVar1 = QSslKey::algorithm(in_stack_ffffffffffffff88);
      if (KVar1 == Dsa) {
        local_68 = (QDebug *)0x3cd697;
        local_60 = (char *)local_68;
      }
      else {
        KVar1 = QSslKey::algorithm(in_stack_ffffffffffffff88);
        if (KVar1 == Dh) {
          in_stack_ffffffffffffff90 = "DH";
          local_60 = in_stack_ffffffffffffff90;
        }
        else {
          in_stack_ffffffffffffff90 = "EC";
          local_60 = in_stack_ffffffffffffff90;
        }
      }
    }
  }
  QDebug::operator<<((QDebug *)local_60,in_RDX);
  this_00 = (QSslKey *)QDebug::operator<<((QDebug *)local_60,in_RDX);
  QSslKey::length(this_00);
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff90,(int)((ulong)this_00 >> 0x20));
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff90,(char)((ulong)this_00 >> 0x38));
  QDebug::QDebug((QDebug *)in_stack_ffffffffffffff90,(QDebug *)this_00);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDebug)in_RDI;
}

Assistant:

QDebug operator<<(QDebug debug, const QSslKey &key)
{
    QDebugStateSaver saver(debug);
    debug.resetFormat().nospace();
    debug << "QSslKey("
          << (key.type() == QSsl::PublicKey ? "PublicKey" : "PrivateKey")
          << ", " << (key.algorithm() == QSsl::Opaque ? "OPAQUE" :
                     (key.algorithm() == QSsl::Rsa ? "RSA" :
                     (key.algorithm() == QSsl::Dsa ? "DSA" :
                     (key.algorithm() == QSsl::Dh ? "DH" : "EC"))))
          << ", " << key.length()
          << ')';
    return debug;
}